

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O1

int AF_A_FireArrow(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double dVar1;
  VM_UBYTE VVar2;
  AActor *source;
  undefined8 *puVar3;
  PClassActor *type;
  AWeapon *this;
  APlayerPawn *this_00;
  PClass *pPVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  undefined4 extraout_var;
  undefined8 uVar8;
  PClass *pPVar9;
  PClassActor *pPVar10;
  VMValue *pVVar11;
  char *pcVar12;
  bool bVar13;
  FSoundID local_2c;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar12 = "(paramnum) < numparam";
    goto LAB_005d1058;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    source = (AActor *)(param->field_0).field_1.a;
    pVVar11 = param;
    uVar6 = numparam;
    if (source != (AActor *)0x0) {
      if ((source->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar5 = (**(source->super_DThinker).super_DObject._vptr_DObject)(source);
        (source->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
      }
      pPVar9 = (source->super_DThinker).super_DObject.Class;
      bVar13 = pPVar9 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar13;
      uVar6 = (uint)bVar13;
      pVVar11 = (VMValue *)(ulong)(pPVar9 == pPVar4 || bVar13);
      if (pPVar9 != pPVar4 && !bVar13) {
        do {
          pPVar9 = pPVar9->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar9 != (PClass *)0x0);
          if (pPVar9 == pPVar4) break;
        } while (pPVar9 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        pcVar12 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005d1058;
      }
    }
    pPVar4 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar2 = param[1].field_0.field_3.Type, VVar2 != 0xff)) {
      if ((VVar2 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005d0ffc;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar8 = (**(code **)*puVar3)(puVar3,pVVar11,uVar6,ret);
          puVar3[1] = uVar8;
        }
        pPVar9 = (PClass *)puVar3[1];
        bVar13 = pPVar9 != (PClass *)0x0;
        if (pPVar9 != pPVar4 && bVar13) {
          do {
            pPVar9 = pPVar9->ParentClass;
            bVar13 = pPVar9 != (PClass *)0x0;
            if (pPVar9 == pPVar4) break;
          } while (pPVar9 != (PClass *)0x0);
        }
        if (!bVar13) {
          pcVar12 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005d1058;
        }
      }
    }
    if (((numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
       ((VVar2 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      if (numparam < 4) {
        pcVar12 = "(paramnum) < numparam";
      }
      else {
        if ((param[3].field_0.field_3.Type == '\x03') &&
           ((param[3].field_0.field_1.atag == 1 || (param[3].field_0.field_1.a == (void *)0x0)))) {
          type = (PClassActor *)param[3].field_0.field_1.a;
          if ((type != (PClassActor *)0x0) &&
             (pPVar10 = type, type != (PClassActor *)AActor::RegistrationInfo.MyClass)) {
            do {
              pPVar10 = (PClassActor *)(pPVar10->super_PClass).ParentClass;
              if (pPVar10 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
            } while (pPVar10 != (PClassActor *)0x0);
            if (pPVar10 == (PClassActor *)0x0) {
              pcVar12 = "ti == NULL || ti->IsDescendantOf(RUNTIME_CLASS(AActor))";
              goto LAB_005d1030;
            }
          }
          if (source->player != (player_t *)0x0) {
            this = source->player->ReadyWeapon;
            if (this == (AWeapon *)0x0) {
              if (type == (PClassActor *)0x0) {
                return 0;
              }
            }
            else {
              bVar13 = AWeapon::DepleteAmmo(this,this->bAltFire,true,-1);
              if (type == (PClassActor *)0x0) {
                return 0;
              }
              if (!bVar13) {
                return 0;
              }
            }
            dVar1 = (source->Angles).Yaw.Degrees;
            uVar6 = FRandom::GenRand32(&pr_electric);
            uVar7 = FRandom::GenRand32(&pr_electric);
            this_00 = source->player->mo;
            iVar5 = (this_00->super_AActor).accuracy;
            (source->Angles).Yaw.Degrees =
                 (1.0 / (double)(1 << ((char)(uint)((ulong)((long)iVar5 * 0x66666667) >> 0x23) -
                                       (char)(iVar5 >> 0x1f) & 0x1fU))) *
                 (double)(int)((uVar6 & 0xff) - (uVar7 & 0xff)) * 0.02197265625 +
                 (source->Angles).Yaw.Degrees;
            APlayerPawn::PlayAttacking2(this_00);
            P_SpawnPlayerMissile(source,type);
            (source->Angles).Yaw.Degrees = dVar1;
            local_2c.ID = S_FindSound("weapons/xbowshoot");
            S_Sound(source,1,&local_2c,1.0,1.0);
          }
          return 0;
        }
        pcVar12 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
      }
LAB_005d1030:
      __assert_fail(pcVar12,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                    ,0xfc,"int AF_A_FireArrow(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    pcVar12 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005d0ffc:
    pcVar12 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005d1058:
  __assert_fail(pcVar12,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                ,0xfb,"int AF_A_FireArrow(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_FireArrow)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_CLASS(ti, AActor);

	DAngle savedangle;

	if (self->player == NULL)
		return 0;

	AWeapon *weapon = self->player->ReadyWeapon;
	if (weapon != NULL)
	{
		if (!weapon->DepleteAmmo (weapon->bAltFire))
			return 0;
	}

	if (ti) 
	{
		savedangle = self->Angles.Yaw;
		self->Angles.Yaw += pr_electric.Random2() * (5.625/256) * self->player->mo->AccuracyFactor();
		self->player->mo->PlayAttacking2 ();
		P_SpawnPlayerMissile (self, ti);
		self->Angles.Yaw = savedangle;
		S_Sound (self, CHAN_WEAPON, "weapons/xbowshoot", 1, ATTN_NORM);
	}
	return 0;
}